

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

ImGuiTableSettings * ImGui::TableSettingsFindByID(ImGuiID id)

{
  char *pcVar1;
  ImGuiTableSettings *pIVar2;
  ImGuiTableSettings *pIVar3;
  
  pcVar1 = (GImGui->SettingsTables).Buf.Data;
  if (pcVar1 != (char *)0x0) {
    pIVar3 = (ImGuiTableSettings *)(pcVar1 + 4);
    pIVar2 = pIVar3;
    do {
      if (pIVar2->ID == id) {
        return pIVar2;
      }
      pIVar2 = (ImGuiTableSettings *)((long)&pIVar2->ID + (long)*(int *)&pIVar2[-1].WantApply);
    } while (pIVar2 != (ImGuiTableSettings *)
                       ((long)&pIVar3->ID + (long)(GImGui->SettingsTables).Buf.Size));
  }
  return (ImGuiTableSettings *)0x0;
}

Assistant:

ImGuiTableSettings* ImGui::TableSettingsFindByID(ImGuiID id)
{
    // FIXME-OPT: Might want to store a lookup map for this?
    ImGuiContext& g = *GImGui;
    for (ImGuiTableSettings* settings = g.SettingsTables.begin(); settings != NULL; settings = g.SettingsTables.next_chunk(settings))
        if (settings->ID == id)
            return settings;
    return NULL;
}